

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O2

int Gia_ManFaultAddOne(Gia_Man_t *pM,Cnf_Dat_t *pCnf,sat_solver *pSat,Vec_Int_t *vLits,int nFuncVars
                      ,int fAddOr,Gia_Man_t *pGiaCnf)

{
  int *piVar1;
  int *piVar2;
  sat_solver *s;
  int iVar3;
  int iVar4;
  int iVar5;
  Gia_Man_t *p;
  Cnf_Dat_t *p_00;
  Gia_Obj_t *pGVar6;
  long lVar7;
  Vec_Int_t *p_01;
  int iVar8;
  int Lit;
  int local_48;
  int local_44;
  sat_solver *local_40;
  Cnf_Dat_t *local_38;
  
  local_48 = fAddOr;
  local_44 = nFuncVars;
  local_38 = pCnf;
  p = Gia_ManFaultCofactor(pM,vLits);
  p_00 = Cnf_DeriveGiaRemapped(p);
  local_40 = pSat;
  iVar3 = sat_solver_nvars(pSat);
  iVar8 = 0;
  while ((iVar8 < p->nObjs && (pGVar6 = Gia_ManObj(p,iVar8), pGVar6 != (Gia_Obj_t *)0x0))) {
    piVar1 = p_00->pVarNums;
    iVar4 = Gia_ObjId(p,pGVar6);
    if (-1 < piVar1[iVar4]) {
      piVar1 = p_00->pVarNums;
      iVar4 = Gia_ObjId(p,pGVar6);
      piVar1[iVar4] = piVar1[iVar4] + iVar3;
    }
    iVar8 = iVar8 + 1;
  }
  s = local_40;
  for (lVar7 = 0; lVar7 < p_00->nLiterals; lVar7 = lVar7 + 1) {
    (*p_00->pClauses)[lVar7] = (*p_00->pClauses)[lVar7] + iVar3 * 2;
  }
  lVar7 = 0;
  while (lVar7 < p_00->nClauses) {
    iVar3 = sat_solver_addclause(s,p_00->pClauses[lVar7],p_00->pClauses[lVar7 + 1]);
    lVar7 = lVar7 + 1;
    if (iVar3 == 0) goto LAB_00495a97;
  }
  if (local_48 != 0) {
    p_01 = Vec_IntAlloc(p->vCos->nSize - p->nRegs);
    iVar3 = 0;
    while ((iVar3 < p->vCos->nSize - p->nRegs &&
           (pGVar6 = Gia_ManCo(p,iVar3), pGVar6 != (Gia_Obj_t *)0x0))) {
      piVar1 = p_00->pVarNums;
      iVar8 = Gia_ObjId(p,pGVar6);
      Lit = Abc_Var2Lit(piVar1[iVar8],0);
      Vec_IntPush(p_01,Lit);
      iVar3 = iVar3 + 1;
    }
    iVar3 = sat_solver_addclause(s,p_01->pArray,p_01->pArray + p_01->nSize);
    if (iVar3 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                    ,0x447,
                    "int Gia_ManFaultAddOne(Gia_Man_t *, Cnf_Dat_t *, sat_solver *, Vec_Int_t *, int, int, Gia_Man_t *)"
                   );
    }
    Vec_IntFree(p_01);
    goto LAB_00495b41;
  }
  iVar3 = 0;
  do {
    if ((p->vCos->nSize - p->nRegs <= iVar3) ||
       (pGVar6 = Gia_ManCo(p,iVar3), pGVar6 == (Gia_Obj_t *)0x0)) {
LAB_00495b41:
      if (pGiaCnf != (Gia_Man_t *)0x0) {
        iVar3 = 0;
        while ((iVar3 < pGiaCnf->vCis->nSize - pGiaCnf->nRegs &&
               (pGVar6 = Gia_ManCi(pGiaCnf,iVar3), pGVar6 != (Gia_Obj_t *)0x0))) {
          if (local_44 <= iVar3) {
            piVar1 = local_38->pVarNums;
            iVar8 = Gia_ObjId(pGiaCnf,pGVar6);
            iVar4 = p->vCis->nSize - p->nRegs;
            if (iVar4 <= iVar3) {
              __assert_fail("v < Gia_ManPiNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
            }
            piVar2 = p_00->pVarNums;
            iVar8 = piVar1[iVar8];
            pGVar6 = Gia_ManCi(p,iVar3);
            iVar5 = Gia_ObjId(p,pGVar6);
            sat_solver_add_buffer(local_40,iVar8,piVar2[iVar5],iVar4);
          }
          iVar3 = iVar3 + 1;
        }
      }
      Cnf_DataFree(p_00);
      Gia_ManStop(p);
      return 1;
    }
    piVar1 = p_00->pVarNums;
    iVar8 = Gia_ObjId(p,pGVar6);
    Lit = Abc_Var2Lit(piVar1[iVar8],1);
    iVar8 = sat_solver_addclause(s,&Lit,&local_48);
    iVar3 = iVar3 + 1;
  } while (iVar8 != 0);
LAB_00495a97:
  Cnf_DataFree(p_00);
  Gia_ManStop(p);
  return 0;
}

Assistant:

int Gia_ManFaultAddOne( Gia_Man_t * pM, Cnf_Dat_t * pCnf, sat_solver * pSat, Vec_Int_t * vLits, int nFuncVars, int fAddOr, Gia_Man_t * pGiaCnf )
{
    Gia_Man_t * pC;//, * pTemp;
    Cnf_Dat_t * pCnf2;
    Gia_Obj_t * pObj;
    int i, Lit;
    // derive the cofactor
    pC = Gia_ManFaultCofactor( pM, vLits );
    // derive new CNF
    pCnf2 = Cnf_DeriveGiaRemapped( pC );
    Cnf_DataLiftGia( pCnf2, pC, sat_solver_nvars(pSat) );
    // add timeframe clauses
    for ( i = 0; i < pCnf2->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf2->pClauses[i], pCnf2->pClauses[i+1] ) )
        {
            Cnf_DataFree( pCnf2 );
            Gia_ManStop( pC );
            return 0;
        }
    // add constraint clauses
    if ( fAddOr )
    {
        // add one OR gate to assert difference of at least one output of the miter
        Vec_Int_t * vOrGate = Vec_IntAlloc( Gia_ManPoNum(pC) );
        Gia_ManForEachPo( pC, pObj, i )
        {
            Lit = Abc_Var2Lit( pCnf2->pVarNums[Gia_ObjId(pC, pObj)], 0 );
            Vec_IntPush( vOrGate, Lit );
        }
        if ( !sat_solver_addclause( pSat, Vec_IntArray(vOrGate), Vec_IntArray(vOrGate) + Vec_IntSize(vOrGate) ) )
            assert( 0 );
        Vec_IntFree( vOrGate );
    }
    else
    {
        // add negative literals to assert equality of all outputs of the miter
        Gia_ManForEachPo( pC, pObj, i )
        {
            Lit = Abc_Var2Lit( pCnf2->pVarNums[Gia_ObjId(pC, pObj)], 1 );
            if ( !sat_solver_addclause( pSat, &Lit, &Lit+1 ) )
            {
                Cnf_DataFree( pCnf2 );
                Gia_ManStop( pC );
                return 0;
            }
        }
    }
    // add connection clauses
    if ( pGiaCnf )
    {
        Gia_ManForEachPi( pGiaCnf, pObj, i )
            if ( i >= nFuncVars )
                sat_solver_add_buffer( pSat, pCnf->pVarNums[Gia_ObjId(pGiaCnf, pObj)], pCnf2->pVarNums[Gia_ObjId(pC, Gia_ManPi(pC, i))], 0 );
    }
    Cnf_DataFree( pCnf2 );
    Gia_ManStop( pC );
    return 1;
}